

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O2

void wallet::MaybePushAddress(UniValue *entry,CTxDestination *dest)

{
  bool bVar1;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff48;
  UniValue in_stack_ffffffffffffff68;
  string local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsValidDestination(dest);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"address",(allocator<char> *)&stack0xffffffffffffff4f);
    EncodeDestination_abi_cxx11_((string *)&stack0xffffffffffffff50,dest);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)&stack0xffffffffffffff70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff50);
    UniValue::pushKV(entry,in_stack_ffffffffffffff48,in_stack_ffffffffffffff68);
    UniValue::~UniValue((UniValue *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string(local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void MaybePushAddress(UniValue & entry, const CTxDestination &dest)
{
    if (IsValidDestination(dest)) {
        entry.pushKV("address", EncodeDestination(dest));
    }
}